

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

int __thiscall smf::MidiEventList::push_back_no_copy(MidiEventList *this,MidiEvent *event)

{
  MidiEvent *local_10;
  
  local_10 = event;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back(&this->list,&local_10)
  ;
  return (int)((ulong)((long)(this->list).
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->list).
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int MidiEventList::push_back_no_copy(MidiEvent* event) {
	list.push_back(event);
	return (int)list.size()-1;
}